

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O1

bool __thiscall ON_Brep::HopAcrossEdge(ON_Brep *this,int *ti,int *tvi)

{
  int iVar1;
  ON_BrepTrim *pOVar2;
  ON_BrepEdge *pOVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  
  lVar7 = (long)*ti;
  if (-1 < lVar7) {
    pOVar2 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
    lVar8 = (long)pOVar2[lVar7].m_ei;
    if (-1 < lVar8) {
      pOVar3 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a;
      if (1 < pOVar3[lVar8].m_ti.m_count) {
        piVar4 = pOVar3[lVar8].m_ti.m_a;
        iVar1 = piVar4[*piVar4 == *ti];
        if (-1 < (long)iVar1) {
          iVar5 = 1 - *tvi;
          if (pOVar2[lVar7].m_bRev3d == false) {
            iVar5 = *tvi;
          }
          iVar6 = 1 - iVar5;
          if (pOVar2[iVar1].m_bRev3d == false) {
            iVar6 = iVar5;
          }
          *ti = iVar1;
          *tvi = iVar6;
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_Brep::HopAcrossEdge( int& ti, int& tvi ) const
{
  // Tf ti is a trim associated with an interior manifold edge,
  // then ti is set to twin.
  int ei, evi, new_ti, new_tvi;
  if ( ti < 0 )
    return false;
  ei = m_T[ti].m_ei;
  if ( ei < 0 )
    return false;
  const ON_BrepEdge& edge = m_E[ei];
  if ( edge.m_ti.Count() < 2 )
    return false;
  evi = (m_T[ti].m_bRev3d) ? 1-tvi : tvi;
  new_ti = edge.m_ti[(edge.m_ti[0] == ti)?1:0];
  if ( new_ti < 0 )
    return false;
  new_tvi = (m_T[new_ti].m_bRev3d) ? 1-evi : evi;
  ti = new_ti;
  tvi = new_tvi;
  return true;
}